

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprCheckPoslists(Fts5ExprNode *pNode,i64 iRowid)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  pNode->iRowid = iRowid;
  pNode->bEof = 0;
  switch(pNode->eType) {
  case 1:
    if (0 < pNode->nChild) {
      lVar4 = 0;
      iVar3 = 0;
      do {
        iVar2 = fts5ExprCheckPoslists(pNode->apChild[lVar4],iRowid);
        if (iVar2 != 0) {
          iVar3 = 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pNode->nChild);
      return iVar3;
    }
    break;
  case 2:
    bVar1 = 0 < pNode->nChild;
    if (0 < pNode->nChild) {
      iVar3 = fts5ExprCheckPoslists(pNode->apChild[0],iRowid);
      if (iVar3 != 0) {
        lVar4 = 7;
        do {
          bVar1 = lVar4 + -6 < (long)pNode->nChild;
          if ((long)pNode->nChild <= lVar4 + -6) {
            return 1;
          }
          iVar3 = fts5ExprCheckPoslists(pNode->apChild[lVar4 + -6],iRowid);
          lVar4 = lVar4 + 1;
        } while (iVar3 != 0);
      }
      fts5ExprClearPoslists(pNode);
      if (bVar1) {
        return 0;
      }
    }
    return 1;
  default:
    iVar3 = fts5ExprCheckPoslists(pNode->apChild[0],iRowid);
    if ((iVar3 != 0) &&
       (iVar3 = fts5ExprCheckPoslists(*(Fts5ExprNode **)(pNode + 1),iRowid), iVar3 == 0)) {
      return 1;
    }
    fts5ExprClearPoslists(pNode);
    break;
  case 4:
  case 9:
    return (uint)(0 < (pNode->pNear->apPhrase[0]->poslist).n);
  }
  return 0;
}

Assistant:

static int fts5ExprCheckPoslists(Fts5ExprNode *pNode, i64 iRowid){
  pNode->iRowid = iRowid;
  pNode->bEof = 0;
  switch( pNode->eType ){
    case FTS5_TERM:
    case FTS5_STRING:
      return (pNode->pNear->apPhrase[0]->poslist.n>0);

    case FTS5_AND: {
      int i;
      for(i=0; i<pNode->nChild; i++){
        if( fts5ExprCheckPoslists(pNode->apChild[i], iRowid)==0 ){
          fts5ExprClearPoslists(pNode);
          return 0;
        }
      }
      break;
    }

    case FTS5_OR: {
      int i;
      int bRet = 0;
      for(i=0; i<pNode->nChild; i++){
        if( fts5ExprCheckPoslists(pNode->apChild[i], iRowid) ){
          bRet = 1;
        }
      }
      return bRet;
    }

    default: {
      assert( pNode->eType==FTS5_NOT );
      if( 0==fts5ExprCheckPoslists(pNode->apChild[0], iRowid)
          || 0!=fts5ExprCheckPoslists(pNode->apChild[1], iRowid)
        ){
        fts5ExprClearPoslists(pNode);
        return 0;
      }
      break;
    }
  }
  return 1;
}